

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu510.c
# Opt level: O1

MPP_RET hal_h264e_vepu510_get_task(void *hal,HalEncTask *task)

{
  long lVar1;
  long lVar2;
  EncRcTask *pEVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  RK_S32 RVar9;
  MppMeta meta;
  long lVar10;
  MppEncCfgSet *cfg;
  undefined8 *puVar11;
  MppPacket packet;
  HalH264eVepuStreamAmend *ctx;
  RK_U32 RVar12;
  H264ePrefixNal *prefix;
  uint uVar13;
  H264eSlice *slice;
  bool bVar14;
  
  lVar1 = *hal;
  lVar2 = *(long *)(lVar1 + 0xea0);
  RVar12 = (task->syntax).number;
  if ((int)RVar12 < 1) {
    bVar14 = true;
  }
  else {
    puVar11 = (undefined8 *)((long)(task->syntax).data + 8);
    uVar13 = 0;
    do {
      switch(*(undefined4 *)(puVar11 + -1)) {
      case 0:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu510","update cfg","update_vepu510_syntax");
        }
        *(undefined8 *)hal = *puVar11;
        break;
      case 1:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu510","update sps","update_vepu510_syntax");
        }
        *(undefined8 *)((long)hal + 0x60) = *puVar11;
        break;
      case 2:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu510","update pps","update_vepu510_syntax");
        }
        *(undefined8 *)((long)hal + 0x68) = *puVar11;
        break;
      case 3:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu510","update dpb","update_vepu510_syntax");
        }
        *(undefined8 *)((long)hal + 0x70) = *puVar11;
        break;
      case 4:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu510","update slice","update_vepu510_syntax");
        }
        *(undefined8 *)((long)hal + 0x188) = *puVar11;
        break;
      case 5:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu510","update frames","update_vepu510_syntax");
        }
        *(undefined8 *)((long)hal + 0x78) = *puVar11;
        break;
      case 6:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu510","update prefix nal","update_vepu510_syntax");
        }
        *(undefined8 *)((long)hal + 0x180) = *puVar11;
        break;
      default:
        _mpp_log_l(4,"hal_h264e_vepu510","invalid syntax type %d\n","update_vepu510_syntax");
      }
      uVar13 = uVar13 | 1 << (*(byte *)(puVar11 + -1) & 0x1f);
      puVar11 = puVar11 + 2;
      RVar12 = RVar12 - 1;
    } while (RVar12 != 0);
    bVar14 = (uVar13 & 1) == 0;
  }
  pEVar3 = task->rc_task;
  lVar4 = *(long *)((long)hal + 0x78);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","enter %p\n","hal_h264e_vepu510_get_task",hal);
  }
  *(uint *)((long)hal + 0x428) = (uint)(*(int *)(*hal + 0x94) == 4);
  *(undefined4 *)((long)hal + 0x42c) = *(undefined4 *)(*hal + 0x1868);
  if (!bVar14) {
    setup_hal_bufs((HalH264eVepu510Ctx *)hal);
  }
  if ((((pEVar3->frm).val & 0x400000000) == 0) &&
     (RVar9 = mpp_frame_has_meta(task->frame), RVar9 != 0)) {
    meta = mpp_frame_get_meta(task->frame);
    mpp_meta_get_ptr(meta,KEY_ROI_DATA,(void **)((long)hal + 0x118));
  }
  if (((pEVar3->frm).val & 0x400000000) == 0) {
    memcpy((void *)((long)hal + 0x2e8),(void *)((long)hal + 0x1b0),0x138);
  }
  if (*(H264eDpb **)((long)hal + 0x70) != (H264eDpb *)0x0) {
    h264e_dpb_hal_start(*(H264eDpb **)((long)hal + 0x70),*(RK_S32 *)(lVar4 + 4));
    h264e_dpb_hal_start(*(H264eDpb **)((long)hal + 0x70),*(RK_S32 *)(lVar4 + 8));
  }
  lVar10 = (long)*(int *)((long)hal + 0x160);
  (task->flags).reg_idx = *(int *)((long)hal + 0x160);
  (task->flags).curr_idx = *(RK_S32 *)(lVar4 + 4);
  (task->flags).refr_idx = *(RK_S32 *)(lVar4 + 8);
  task->part_first = 1;
  task->part_last = 0;
  *(undefined8 *)((long)hal + 400) = *(undefined8 *)((long)hal + lVar10 * 8 + 0x48);
  *(long *)((long)hal + 0x170) = lVar10 * 0xe90 + *(long *)((long)hal + 0x140);
  ctx = (HalH264eVepuStreamAmend *)(lVar10 * 0x60 + *(long *)((long)hal + 0x148));
  *(HalH264eVepuStreamAmend **)((long)hal + 0x178) = ctx;
  *(undefined4 *)(lVar1 + 0x364) = *(undefined4 *)(*(long *)((long)hal + 0x60) + 0x28);
  if ((*(uint *)((long)hal + 0x14) < 2) ||
     ((*(int *)(lVar2 + 0x1c) == 0 && (*(int *)(lVar2 + 0x20) < 2)))) {
    packet = task->packet;
    slice = *(H264eSlice **)((long)hal + 0x188);
    cfg = *hal;
    prefix = *(H264ePrefixNal **)((long)hal + 0x180);
  }
  else {
    slice = (H264eSlice *)(lVar10 * 0x90 + *(long *)((long)hal + 0x158));
    puVar11 = *(undefined8 **)((long)hal + 0x180);
    if (puVar11 == (undefined8 *)0x0) {
      prefix = (H264ePrefixNal *)0x0;
    }
    else {
      prefix = (H264ePrefixNal *)(*(long *)((long)hal + 0x150) + lVar10 * 0x28);
      uVar5 = puVar11[4];
      prefix->discardable_flag = (int)uVar5;
      prefix->output_flag = (int)((ulong)uVar5 >> 0x20);
      uVar5 = *puVar11;
      uVar6 = puVar11[1];
      uVar7 = puVar11[2];
      uVar8 = puVar11[3];
      prefix->dependency_id = (int)uVar7;
      prefix->quality_id = (int)((ulong)uVar7 >> 0x20);
      prefix->temporal_id = (int)uVar8;
      prefix->use_ref_base_pic_flag = (int)((ulong)uVar8 >> 0x20);
      prefix->nal_ref_idc = (int)uVar5;
      prefix->idr_flag = (int)((ulong)uVar5 >> 0x20);
      prefix->priority_id = (int)uVar6;
      prefix->no_inter_layer_pred_flag = (int)((ulong)uVar6 >> 0x20);
    }
    if (*(void **)((long)hal + 0x188) != (void *)0x0) {
      memcpy(slice,*(void **)((long)hal + 0x188),0x90);
      lVar1 = *(long *)((long)hal + 0x178);
      *(undefined8 *)(lVar1 + 0x18) = *(undefined8 *)((long)hal + 0x80);
      *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)((long)hal + 0x88);
    }
    cfg = *hal;
    ctx = *(HalH264eVepuStreamAmend **)((long)hal + 0x178);
    packet = task->packet;
  }
  h264e_vepu_stream_amend_config(ctx,packet,cfg,slice,prefix);
  if (1 < *(uint *)((long)hal + 0x14)) {
    *(uint *)((long)hal + 0x160) = (uint)(*(int *)((long)hal + 0x160) == 0);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","leave %p\n","hal_h264e_vepu510_get_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu510_get_task(void *hal, HalEncTask *task)
{
    HalH264eVepu510Ctx *ctx = (HalH264eVepu510Ctx *)hal;
    MppEncCfgSet *cfg_set = ctx->cfg;
    MppEncRefCfgImpl *ref = (MppEncRefCfgImpl *)cfg_set->ref_cfg;
    MppEncH264HwCfg *hw_cfg = &cfg_set->codec.h264.hw_cfg;
    RK_U32 updated = update_vepu510_syntax(ctx, &task->syntax);
    EncFrmStatus *frm_status = &task->rc_task->frm;
    H264eFrmInfo *frms = ctx->frms;

    hal_h264e_dbg_func("enter %p\n", hal);

    ctx->smart_en = (ctx->cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC);
    ctx->qpmap_en = ctx->cfg->tune.deblur_en;

    if (updated & SYN_TYPE_FLAG(H264E_SYN_CFG))
        setup_hal_bufs(ctx);

    if (!frm_status->reencode && mpp_frame_has_meta(task->frame)) {
        MppMeta meta = mpp_frame_get_meta(task->frame);
        mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void **)&ctx->roi_data);
    }

    if (!frm_status->reencode)
        ctx->last_frame_fb = ctx->feedback;

    if (ctx->dpb) {
        h264e_dpb_hal_start(ctx->dpb, frms->curr_idx);
        h264e_dpb_hal_start(ctx->dpb, frms->refr_idx);
    }

    task->flags.reg_idx = ctx->task_idx;
    task->flags.curr_idx = frms->curr_idx;
    task->flags.refr_idx = frms->refr_idx;
    task->part_first = 1;
    task->part_last = 0;

    ctx->ext_line_buf = ctx->ext_line_bufs[ctx->task_idx];
    ctx->regs_set = &ctx->regs_sets[ctx->task_idx];
    ctx->amend = &ctx->amend_sets[ctx->task_idx];

    /* if not VEPU1/2, update log2_max_frame_num_minus4 in hw_cfg */
    hw_cfg->hw_log2_max_frame_num_minus4 = ctx->sps->log2_max_frame_num_minus4;

    if (ctx->task_cnt > 1 && (ref->lt_cfg_cnt || ref->st_cfg_cnt > 1)) {
        H264ePrefixNal *prefix = &ctx->prefix_sets[ctx->task_idx];
        H264eSlice *slice = &ctx->slice_sets[ctx->task_idx];

        //store async encode TSVC info
        if (ctx->prefix)
            memcpy(prefix, ctx->prefix, sizeof(H264ePrefixNal));
        else
            prefix = NULL;

        if (ctx->slice) {
            memcpy(slice, ctx->slice, sizeof(H264eSlice));

            /*
             * Generally, reorder and marking are shared by dpb and slice.
             * However, async encoding TSVC will change reorder and marking in each task.
             * Therefore, malloc a special space for async encoding TSVC.
             */
            ctx->amend->reorder = ctx->reorder;
            ctx->amend->marking = ctx->marking;
        }

        h264e_vepu_stream_amend_config(ctx->amend, task->packet, ctx->cfg,
                                       slice, prefix);
    } else {
        h264e_vepu_stream_amend_config(ctx->amend, task->packet, ctx->cfg,
                                       ctx->slice, ctx->prefix);
    }

    if (ctx->task_cnt > 1)
        ctx->task_idx = !ctx->task_idx;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}